

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

_test_iteration * __thiscall
glcts::TessellationShaderInvarianceRule5Test::getTestForIteration
          (TessellationShaderInvarianceRule5Test *this,uint n_iteration)

{
  size_type sVar1;
  reference local_30;
  _test_iteration *test_iteration;
  uint n_triangles_tests;
  uint n_iteration_local;
  TessellationShaderInvarianceRule5Test *this_local;
  
  sVar1 = std::
          vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
          ::size(&this->m_test_triangles_iterations);
  if (n_iteration < (uint)sVar1) {
    local_30 = std::
               vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
               ::operator[](&this->m_test_triangles_iterations,(ulong)n_iteration);
  }
  else {
    local_30 = std::
               vector<glcts::TessellationShaderInvarianceRule5Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule5Test::_test_iteration>_>
               ::operator[](&this->m_test_quads_iterations,(ulong)(n_iteration - (uint)sVar1));
  }
  return local_30;
}

Assistant:

TessellationShaderInvarianceRule5Test::_test_iteration& TessellationShaderInvarianceRule5Test::getTestForIteration(
	unsigned int n_iteration)
{
	unsigned int	 n_triangles_tests = (unsigned int)m_test_triangles_iterations.size();
	_test_iteration& test_iteration	= (n_iteration < n_triangles_tests) ?
										  m_test_triangles_iterations[n_iteration] :
										  m_test_quads_iterations[n_iteration - n_triangles_tests];

	return test_iteration;
}